

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_int8.h
# Opt level: O2

void ncnn::lstm_dynamic_quantize_scale2int8(float *ptr,int size,float scale,char *outptr)

{
  float fVar1;
  undefined1 auVar2 [32];
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 in_register_00001204 [12];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  uint uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined8 uVar26;
  undefined1 auVar28 [32];
  undefined1 in_ZMM8 [64];
  
  auVar7._4_12_ = in_register_00001204;
  auVar7._0_4_ = scale;
  auVar9 = vbroadcastss_avx512f(auVar7);
  uVar3 = 0;
  auVar10 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
  auVar11 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
  auVar16[8] = 0x81;
  auVar16._0_8_ = 0x8181818181818181;
  auVar16[9] = 0x81;
  auVar16[10] = 0x81;
  auVar16[0xb] = 0x81;
  auVar16[0xc] = 0x81;
  auVar16[0xd] = 0x81;
  auVar16[0xe] = 0x81;
  auVar16[0xf] = 0x81;
  auVar14[8] = 0x7f;
  auVar14._0_8_ = 0x7f7f7f7f7f7f7f7f;
  auVar14[9] = 0x7f;
  auVar14[10] = 0x7f;
  auVar14[0xb] = 0x7f;
  auVar14[0xc] = 0x7f;
  auVar14[0xd] = 0x7f;
  auVar14[0xe] = 0x7f;
  auVar14[0xf] = 0x7f;
  for (; (int)uVar3 + 0xf < size; uVar3 = uVar3 + 0x10) {
    auVar12 = vmulps_avx512f(auVar9,*(undefined1 (*) [64])ptr);
    auVar13 = vmovdqa64_avx512f(auVar10);
    auVar13 = vpternlogd_avx512f(auVar13,auVar12,auVar11,0xf8);
    auVar12 = vaddps_avx512f(auVar12,auVar13);
    auVar12 = vcvttps2dq_avx512f(auVar12);
    auVar7 = vpmovsdb_avx512f(auVar12);
    auVar7 = vpmaxsb_avx(auVar7,auVar16);
    auVar7 = vpaddb_avx(auVar7,auVar14);
    *(undefined1 (*) [16])(outptr + uVar3) = auVar7;
    ptr = (float *)((long)ptr + 0x40);
  }
  auVar19._8_4_ = 0x3f000000;
  auVar19._0_8_ = 0x3f0000003f000000;
  auVar19._12_4_ = 0x3f000000;
  auVar19._16_4_ = 0x3f000000;
  auVar19._20_4_ = 0x3f000000;
  auVar19._24_4_ = 0x3f000000;
  auVar19._28_4_ = 0x3f000000;
  auVar21._8_4_ = 0x80000000;
  auVar21._0_8_ = 0x8000000080000000;
  auVar21._12_4_ = 0x80000000;
  auVar21._16_4_ = 0x80000000;
  auVar21._20_4_ = 0x80000000;
  auVar21._24_4_ = 0x80000000;
  auVar21._28_4_ = 0x80000000;
  auVar2 = vpmovsxbq_avx2(ZEXT416(0x20181008));
  for (; (int)uVar3 + 7 < size; uVar3 = uVar3 + 8) {
    auVar9._0_4_ = scale * *(float *)*(undefined1 (*) [64])ptr;
    auVar9._4_4_ = scale * *(float *)(*(undefined1 (*) [64])ptr + 4);
    auVar9._8_4_ = scale * *(float *)(*(undefined1 (*) [64])ptr + 8);
    auVar9._12_4_ = scale * *(float *)(*(undefined1 (*) [64])ptr + 0xc);
    auVar9._16_4_ = scale * *(float *)(*(undefined1 (*) [64])ptr + 0x10);
    auVar9._20_4_ = scale * *(float *)(*(undefined1 (*) [64])ptr + 0x14);
    auVar9._28_36_ = in_ZMM8._28_36_;
    auVar9._24_4_ = scale * *(float *)(*(undefined1 (*) [64])ptr + 0x18);
    auVar8 = vpternlogd_avx512vl(auVar19,auVar9._0_32_,auVar21,0xf8);
    auVar28._0_4_ = (int)(auVar9._0_4_ + auVar8._0_4_);
    auVar28._4_4_ = (int)(auVar9._4_4_ + auVar8._4_4_);
    auVar28._8_4_ = (int)(auVar9._8_4_ + auVar8._8_4_);
    auVar28._12_4_ = (int)(auVar9._12_4_ + auVar8._12_4_);
    auVar28._16_4_ = (int)(auVar9._16_4_ + auVar8._16_4_);
    auVar28._20_4_ = (int)(auVar9._20_4_ + auVar8._20_4_);
    auVar28._24_4_ = (int)(auVar9._24_4_ + auVar8._24_4_);
    auVar28._28_4_ = (int)(in_ZMM8._28_4_ + auVar8._28_4_);
    auVar7 = vpmovsdb_avx512vl(auVar28);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = auVar7._0_8_;
    auVar17 = vpmaxsb_avx(auVar27,auVar16);
    uVar26 = auVar17._0_8_;
    auVar8._8_8_ = uVar26;
    auVar8._0_8_ = uVar26;
    auVar8._16_8_ = uVar26;
    auVar8._24_8_ = uVar26;
    auVar8 = vpsrlvq_avx2(auVar8,auVar2);
    auVar7 = vpmovqb_avx512vl(auVar8);
    auVar7 = vpunpcklbw_avx(ZEXT416(auVar7._0_4_),auVar17);
    auVar7 = vpshufb_avx(auVar7,ZEXT816(0x604020001));
    auVar7 = vpinsrb_avx(auVar7,auVar17._4_4_ >> 8,5);
    auVar7 = vpinsrb_avx(auVar7,(uint)auVar17._6_2_,6);
    auVar7 = vpinsrb_avx(auVar7,(uint)auVar17[7],7);
    auVar7 = vpaddb_avx(auVar7,auVar14);
    in_ZMM8 = ZEXT1664(auVar7);
    *(long *)(outptr + uVar3) = auVar7._0_8_;
    ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
  }
  auVar18._8_4_ = 0x3f000000;
  auVar18._0_8_ = 0x3f0000003f000000;
  auVar18._12_4_ = 0x3f000000;
  auVar17._8_4_ = 0x80000000;
  auVar17._0_8_ = 0x8000000080000000;
  auVar17._12_4_ = 0x80000000;
  auVar20._8_2_ = 0x7f;
  auVar20._0_8_ = 0x7f007f007f007f;
  auVar20._10_2_ = 0x7f;
  auVar20._12_2_ = 0x7f;
  auVar20._14_2_ = 0x7f;
  auVar22._8_2_ = 0xff81;
  auVar22._0_8_ = 0xff81ff81ff81ff81;
  auVar22._10_2_ = 0xff81;
  auVar22._12_2_ = 0xff81;
  auVar22._14_2_ = 0xff81;
  for (; (int)uVar3 + 3 < size; uVar3 = uVar3 + 4) {
    auVar24._0_4_ = scale * *(float *)*(undefined1 (*) [64])ptr;
    auVar24._4_4_ = scale * *(float *)(*(undefined1 (*) [64])ptr + 4);
    auVar24._8_4_ = scale * *(float *)(*(undefined1 (*) [64])ptr + 8);
    auVar24._12_4_ = scale * *(float *)(*(undefined1 (*) [64])ptr + 0xc);
    auVar7 = vpternlogd_avx512vl(auVar18,auVar24,auVar17,0xf8);
    auVar25._0_4_ = (int)(auVar7._0_4_ + auVar24._0_4_);
    auVar25._4_4_ = (int)(auVar7._4_4_ + auVar24._4_4_);
    auVar25._8_4_ = (int)(auVar7._8_4_ + auVar24._8_4_);
    auVar25._12_4_ = (int)(auVar7._12_4_ + auVar24._12_4_);
    auVar7 = vpackssdw_avx(auVar25,auVar25);
    auVar7 = vpminsw_avx(auVar7,auVar20);
    auVar7 = vpmaxsw_avx(auVar7,auVar22);
    auVar7 = vpacksswb_avx(auVar7,auVar7);
    uVar23 = auVar7._0_4_;
    auVar7 = vpmovdb_avx512vl(auVar7);
    auVar7 = vpinsrb_avx(ZEXT416(auVar7._0_4_),uVar23 >> 8,1);
    auVar7 = vpinsrb_avx(auVar7,uVar23 >> 0x10,2);
    auVar7 = vpinsrb_avx(auVar7,uVar23 >> 0x18,3);
    auVar7 = vpaddb_avx(auVar7,auVar14);
    *(int *)(outptr + uVar3) = auVar7._0_4_;
    ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
  }
  auVar15._8_4_ = 0x3effffff;
  auVar15._0_8_ = 0x3effffff3effffff;
  auVar15._12_4_ = 0x3effffff;
  lVar4 = 0;
  for (uVar5 = uVar3 & 0xffffffff; (int)uVar5 < size; uVar5 = (ulong)((int)uVar5 + 1)) {
    fVar1 = scale * *(float *)(*(undefined1 (*) [64])ptr + lVar4 * 4);
    auVar7 = vpternlogd_avx512vl(auVar15,ZEXT416((uint)fVar1),auVar17,0xf8);
    auVar7 = ZEXT416((uint)(fVar1 + auVar7._0_4_));
    auVar7 = vroundss_avx(auVar7,auVar7,0xb);
    iVar6 = (int)auVar7._0_4_;
    if (iVar6 < -0x7e) {
      iVar6 = -0x7f;
    }
    if (0x7e < iVar6) {
      iVar6 = 0x7f;
    }
    outptr[uVar3 + lVar4] = (char)iVar6;
    lVar4 = lVar4 + 1;
  }
  return;
}

Assistant:

static void lstm_dynamic_quantize_scale2int8(const float* ptr, int size, float scale, signed char* outptr)
{
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        lstm_dynamic_quantize_scale2int8_avx512vnni(ptr, size, scale, outptr);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX__ && !__AVX512F__ && !__AVXVNNI__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        lstm_dynamic_quantize_scale2int8_avxvnni(ptr, size, scale, outptr);
        return;
    }
#endif

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _scale_avx512 = _mm512_set1_ps(scale);
#if __AVX512VNNI__
    __m128i _v127 = _mm_set1_epi8(127);
#endif
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        _p = _mm512_mul_ps(_p, _scale_avx512);
        __m128i _outp = float2int8_avx512(_p);
#if __AVX512VNNI__
        _outp = _mm_add_epi8(_outp, _v127);
#endif
        _mm_storeu_si128((__m128i*)outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    __m256 _scale_avx = _mm256_set1_ps(scale);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        _p = _mm256_mul_ps(_p, _scale_avx);
        *(int64_t*)outptr = float2int8_avx(_p);
#if __AVXVNNI__ || __AVX512VNNI__
        outptr[0] += 127;
        outptr[1] += 127;
        outptr[2] += 127;
        outptr[3] += 127;
        outptr[4] += 127;
        outptr[5] += 127;
        outptr[6] += 127;
        outptr[7] += 127;
#endif
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    __m128 _scale = _mm_set1_ps(scale);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        _p = _mm_mul_ps(_p, _scale);
        *(int32_t*)outptr = float2int8_sse(_p);
#ifndef _MSC_VER
        // vs2019 crash on 128bit vnni :L   --- nihui
#if __AVXVNNI__ || __AVX512VNNI__
        outptr[0] += 127;
        outptr[1] += 127;
        outptr[2] += 127;
        outptr[3] += 127;
#endif
#endif
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr++ = float2int8(*ptr++ * scale);
    }
}